

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O1

string * license::trim_copy(string *__return_storage_ptr__,string *string_to_trim)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  char *pcVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __tmp;
  char *pcVar7;
  
  pcVar5 = (string_to_trim->_M_dataplus)._M_p;
  sVar4 = string_to_trim->_M_string_length;
  pcVar1 = pcVar5 + sVar4;
  pcVar6 = pcVar5;
  while ((sVar4 != 0 && (iVar3 = isspace((int)*pcVar5), pcVar6 = pcVar5, iVar3 != 0))) {
    pcVar5 = pcVar5 + 1;
    sVar4 = sVar4 - 1;
    pcVar6 = pcVar1;
  }
  do {
    pcVar7 = pcVar1;
    pcVar5 = pcVar6;
    if (pcVar7 == pcVar6) break;
    cVar2 = pcVar7[-1];
    iVar3 = isspace((int)cVar2);
    pcVar1 = pcVar7 + -1;
  } while ((cVar2 == '\0') || (pcVar5 = pcVar7, iVar3 != 0));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

string trim_copy(const string &string_to_trim) {
	std::string::const_iterator it = string_to_trim.begin();
	while (it != string_to_trim.end() && isspace(*it)) {
		++it;
	}
	std::string::const_reverse_iterator rit = string_to_trim.rbegin();
	while (rit.base() != it && (isspace(*rit) || *rit == 0)) {
		++rit;
	}
	return std::string(it, rit.base());
}